

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb-emu.c
# Opt level: O1

int sdl2_handle_input(Input *i)

{
  int iVar1;
  SDL_Event event;
  int local_60 [3];
  char local_54;
  int local_4c;
  
  iVar1 = SDL_PollEvent(local_60);
  if (iVar1 == 0) {
    return 0;
  }
  do {
    if (local_60[0] < 0x300) {
      if (local_60[0] == 0x200) {
        if (local_54 == '\x0e') {
LAB_001015bc:
          i->type = Quit;
          return 1;
        }
      }
      else if (local_60[0] == 0x100) goto LAB_001015bc;
    }
    else if (local_60[0] == 0x300) {
      i->type = KeyDown;
      if (local_4c < 100) {
LAB_0010157a:
        if (local_4c == 8) {
          i->button = Button_Select;
          return 1;
        }
        if (local_4c == 0xd) {
          i->button = Button_Start;
          return 1;
        }
        if (local_4c == 0x61) {
          i->button = Button_Left;
          return 1;
        }
      }
      else {
        switch(local_4c) {
        case 0x73:
switchD_00101558_caseD_73:
          i->button = Button_Down;
          return 1;
        case 0x74:
        case 0x75:
        case 0x76:
        case 0x79:
          break;
        case 0x77:
switchD_00101558_caseD_77:
          i->button = Button_Up;
          return 1;
        case 0x78:
switchD_00101558_caseD_78:
          i->button = Button_B;
          return 1;
        case 0x7a:
switchD_00101558_caseD_7a:
          i->button = Button_A;
          return 1;
        default:
switchD_00101558_default:
          if (local_4c == 100) {
            i->button = Button_Right;
            return 1;
          }
        }
      }
    }
    else if (local_60[0] == 0x301) {
      i->type = KeyUp;
      if (99 < local_4c) {
        switch(local_4c) {
        case 0x73:
          goto switchD_00101558_caseD_73;
        case 0x74:
        case 0x75:
        case 0x76:
        case 0x79:
          goto switchD_00101558_caseD_74;
        case 0x77:
          goto switchD_00101558_caseD_77;
        case 0x78:
          goto switchD_00101558_caseD_78;
        case 0x7a:
          goto switchD_00101558_caseD_7a;
        default:
          goto switchD_00101558_default;
        }
      }
      goto LAB_0010157a;
    }
switchD_00101558_caseD_74:
    iVar1 = SDL_PollEvent(local_60);
    if (iVar1 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int
sdl2_handle_input(Input* i) {

    SDL_Event event;
    while (SDL_PollEvent(&event)) {
        switch (event.type) {
        
        case SDL_QUIT:
            i->type = Quit;
            return 1;
        
        case SDL_WINDOWEVENT:
            if(event.window.event == SDL_WINDOWEVENT_CLOSE) {
                i->type = Quit;
                return 1;
            }
            break;
        
        case SDL_KEYDOWN:
            i->type = KeyDown;
            switch(event.key.keysym.sym) {
                case SDLK_z:
                    i->button = Button_A;
                    return 1;
                case SDLK_x:
                    i->button = Button_B;
                    return 1;
                case SDLK_RETURN:
                    i->button = Button_Start;
                    return 1;
                case SDLK_BACKSPACE:
                    i->button = Button_Select;
                    return 1;
                case SDLK_w:
                    i->button = Button_Up;
                    return 1;
                case SDLK_s:
                    i->button = Button_Down;
                    return 1;
                case SDLK_d:
                    i->button = Button_Right;
                    return 1;
                case SDLK_a:
                    i->button = Button_Left;
                    return 1;
                default:
                    break;
            }
        break;

        case SDL_KEYUP:
            i->type = KeyUp;
            switch(event.key.keysym.sym) {
                case SDLK_z:
                    i->button = Button_A;
                    return 1;
                case SDLK_x:
                    i->button = Button_B;
                    return 1;
                case SDLK_RETURN:
                    i->button = Button_Start;
                    return 1;
                case SDLK_BACKSPACE:
                    i->button = Button_Select;
                    return 1;
                case SDLK_w:
                    i->button = Button_Up;
                    return 1;
                case SDLK_s:
                    i->button = Button_Down;
                    return 1;
                case SDLK_d:
                    i->button = Button_Right;
                    return 1;
                case SDLK_a:
                    i->button = Button_Left;
                    return 1;
                default:
                    break;
            }
        break;

        default:
            break;
        }
    }

    return 0;
}